

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set_test.cc
# Opt level: O3

FileMetaData * __thiscall
leveldb::AddBoundaryInputsTest::CreateFileMetaData
          (AddBoundaryInputsTest *this,uint64_t number,InternalKey *smallest,InternalKey *largest)

{
  pointer *pppFVar1;
  iterator __position;
  FileMetaData *pFVar2;
  FileMetaData *f;
  FileMetaData *local_38;
  
  pFVar2 = (FileMetaData *)operator_new(0x58);
  pFVar2->refs = 0;
  pFVar2->allowed_seeks = 0x40000000;
  pFVar2->file_size = 0;
  (pFVar2->smallest).rep_._M_dataplus._M_p = (pointer)&(pFVar2->smallest).rep_.field_2;
  (pFVar2->smallest).rep_._M_string_length = 0;
  (pFVar2->smallest).rep_.field_2._M_local_buf[0] = '\0';
  (pFVar2->largest).rep_._M_dataplus._M_p = (pointer)&(pFVar2->largest).rep_.field_2;
  (pFVar2->largest).rep_._M_string_length = 0;
  (pFVar2->largest).rep_.field_2._M_local_buf[0] = '\0';
  pFVar2->number = number;
  local_38 = pFVar2;
  std::__cxx11::string::_M_assign((string *)&pFVar2->smallest);
  std::__cxx11::string::_M_assign((string *)&pFVar2->largest);
  __position._M_current =
       (this->all_files_).
       super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->all_files_).
      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>::
    _M_realloc_insert<leveldb::FileMetaData*const&>
              ((vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>> *)
               &this->all_files_,__position,&local_38);
  }
  else {
    *__position._M_current = pFVar2;
    pppFVar1 = &(this->all_files_).
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppFVar1 = *pppFVar1 + 1;
    local_38 = pFVar2;
  }
  return local_38;
}

Assistant:

FileMetaData* CreateFileMetaData(uint64_t number, InternalKey smallest,
                                   InternalKey largest) {
    FileMetaData* f = new FileMetaData();
    f->number = number;
    f->smallest = smallest;
    f->largest = largest;
    all_files_.push_back(f);
    return f;
  }